

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  bool bVar4;
  void *pvVar5;
  void *pvVar6;
  xml_node_struct *pxVar7;
  xml_node_struct *pxVar8;
  xml_attribute_struct *pxVar9;
  xml_node_struct *rn;
  xml_node_struct *ln;
  
  pvVar5 = document_buffer_order((xpath_node *)this);
  pvVar6 = document_buffer_order(lhs);
  if (pvVar6 != (void *)0x0 && pvVar5 != (void *)0x0) {
    return pvVar5 < pvVar6;
  }
  pxVar9 = *(xml_attribute_struct **)(this + 8);
  pxVar1 = (lhs->_attribute)._attr;
  pxVar8 = (xml_node_struct *)0x0;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    pxVar8 = (lhs->_node)._root;
  }
  pxVar7 = *(xml_node_struct **)this;
  if (pxVar9 == (xml_attribute_struct *)0x0) {
LAB_00111f9e:
    if (pxVar1 == (xml_attribute_struct *)0x0) goto LAB_00111fab;
    if ((lhs->_node)._root == *(xml_node_struct **)this) {
      return true;
    }
  }
  else {
    if (pxVar1 == (xml_attribute_struct *)0x0) {
      pxVar7 = (xml_node_struct *)0x0;
      if (pxVar9 != (xml_attribute_struct *)0x0) {
        if (*(xml_node_struct **)this == pxVar8) {
          return false;
        }
        pxVar7 = *(xml_node_struct **)this;
        goto LAB_00111fab;
      }
      goto LAB_00111f9e;
    }
    if (*(xml_node_struct **)this == (lhs->_node)._root) {
      if (pxVar9 == pxVar1) {
        return true;
      }
      do {
        pxVar9 = pxVar9->next_attribute;
        if (pxVar9 == (xml_attribute_struct *)0x0) break;
      } while (pxVar9 != pxVar1);
      return pxVar9 != (xml_attribute_struct *)0x0;
    }
    pxVar7 = *(xml_node_struct **)this;
  }
  pxVar8 = (lhs->_node)._root;
LAB_00111fab:
  if (pxVar7 == pxVar8) {
    return false;
  }
  if ((pxVar8 == (xml_node_struct *)0x0) ||
     (pxVar2 = pxVar7, pxVar3 = pxVar8, pxVar7 == (xml_node_struct *)0x0)) {
    return pxVar7 < pxVar8;
  }
  while ((rn = pxVar3, ln = pxVar2, ln != (xml_node_struct *)0x0 && (rn != (xml_node_struct *)0x0)))
  {
    pxVar2 = ln->parent;
    pxVar3 = rn->parent;
    if (ln->parent == rn->parent) goto LAB_00112046;
  }
  bVar4 = ln == (xml_node_struct *)0x0;
  if (!bVar4) {
    do {
      ln = ln->parent;
      pxVar7 = pxVar7->parent;
    } while (ln != (xml_node_struct *)0x0);
  }
  for (; rn != (xml_node_struct *)0x0; rn = rn->parent) {
    pxVar8 = pxVar8->parent;
  }
  if (pxVar7 == pxVar8) {
    return bVar4;
  }
  do {
    rn = pxVar8;
    ln = pxVar7;
    pxVar7 = ln->parent;
    pxVar8 = rn->parent;
  } while (ln->parent != rn->parent);
LAB_00112046:
  bVar4 = node_is_before_sibling(ln,rn);
  return bVar4;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}